

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::GetNode
          (TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this,
          FMD5Holder key)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 != (Node *)0x0) {
    return pNVar1;
  }
  pNVar1 = NewKey(this,key);
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}